

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFObjectHandle::parse
          (QPDFObjectHandle *this,QPDF *context,string *object_str,string *object_description)

{
  int iVar1;
  unsigned_long uVar2;
  char *pcVar3;
  QPDFExc *this_00;
  qpdf_offset_t offset;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar4;
  allocator<char> local_15a;
  allocator<char> local_159;
  Buffer buf;
  string local_150;
  string local_130;
  BufferInputSource input;
  
  Buffer::Buffer(&buf,object_str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"parsed object",(allocator<char> *)&local_130);
  BufferInputSource::BufferInputSource(&input,&local_150,&buf,false);
  std::__cxx11::string::~string((string *)&local_150);
  QPDFParser::parse((QPDFParser *)this,&input.super_InputSource,object_description,context);
  local_150._M_dataplus._M_p = (pointer)BufferInputSource::tell(&input);
  uVar2 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                    ((longlong *)&local_150);
  do {
    if (object_str->_M_string_length <= uVar2) {
      BufferInputSource::~BufferInputSource(&input);
      Buffer::~Buffer(&buf);
      QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (QPDFObjectHandle)
             QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
    }
    pcVar3 = (char *)std::__cxx11::string::at((ulong)object_str);
    iVar1 = isspace((int)*pcVar3);
    uVar2 = uVar2 + 1;
  } while (iVar1 != 0);
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"parsed object",&local_159);
  offset = InputSource::getLastOffset(&input.super_InputSource);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"trailing data found parsing object from string",&local_15a);
  QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,&local_150,object_description,offset,&local_130);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::parse(
    QPDF* context, std::string const& object_str, std::string const& object_description)
{
    // BufferInputSource does not modify the input, but Buffer either requires a string& or copies
    // the string.
    Buffer buf(const_cast<std::string&>(object_str));
    auto input = BufferInputSource("parsed object", &buf);
    auto result = QPDFParser::parse(input, object_description, context);
    size_t offset = QIntC::to_size(input.tell());
    while (offset < object_str.length()) {
        if (!isspace(object_str.at(offset))) {
            QTC::TC("qpdf", "QPDFObjectHandle trailing data in parse");
            throw QPDFExc(
                qpdf_e_damaged_pdf,
                "parsed object",
                object_description,
                input.getLastOffset(),
                "trailing data found parsing object from string");
        }
        ++offset;
    }
    return result;
}